

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O0

void cmGccDepfile_yy_switch_to_buffer(YY_BUFFER_STATE_conflict new_buffer,yyscan_t yyscanner)

{
  undefined8 local_30;
  undefined8 local_28;
  yyguts_t_conflict1 *yyg;
  yyscan_t yyscanner_local;
  YY_BUFFER_STATE_conflict new_buffer_local;
  
  cmGccDepfile_yyensure_buffer_stack(yyscanner);
  if (*(long *)((long)yyscanner + 0x28) == 0) {
    local_28 = (YY_BUFFER_STATE_conflict)0x0;
  }
  else {
    local_28 = *(YY_BUFFER_STATE_conflict *)
                (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  }
  if (local_28 != new_buffer) {
    if (*(long *)((long)yyscanner + 0x28) == 0) {
      local_30 = 0;
    }
    else {
      local_30 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8
                          );
    }
    if (local_30 != 0) {
      **(undefined1 **)((long)yyscanner + 0x48) = *(undefined1 *)((long)yyscanner + 0x30);
      *(undefined8 *)
       (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 0x10)
           = *(undefined8 *)((long)yyscanner + 0x48);
      *(undefined8 *)
       (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) + 0x20)
           = *(undefined8 *)((long)yyscanner + 0x38);
    }
    *(YY_BUFFER_STATE_conflict *)
     (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) = new_buffer;
    cmGccDepfile_yy_load_buffer_state(yyscanner);
    *(undefined4 *)((long)yyscanner + 0x58) = 1;
  }
  return;
}

Assistant:

void yy_switch_to_buffer  (YY_BUFFER_STATE  new_buffer , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack (yyscanner);
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*yyg->yy_c_buf_p = yyg->yy_hold_char;
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = yyg->yy_c_buf_p;
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state( yyscanner );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	yyg->yy_did_buffer_switch_on_eof = 1;
}